

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# files.c
# Opt level: O1

void paniclog(char *type,char *reason)

{
  char *pcVar1;
  FILE *__stream;
  long lVar2;
  char *pcVar3;
  char buf [256];
  
  if (program_state.in_paniclog == 0) {
    program_state.in_paniclog = 1;
    pcVar1 = fqname("paniclog",4,3);
    __stream = fopen(pcVar1,"a");
    if (__stream != (FILE *)0x0) {
      pcVar1 = version_string(buf);
      lVar2 = yyyymmdd(0x19f072);
      pcVar3 = "(none)";
      if (plname[0] != '\0') {
        pcVar3 = plname;
      }
      fprintf(__stream,"%s %08ld, %ld %s: %s %s\n",pcVar1,lVar2,u.ubirthday,pcVar3,type,reason);
      fclose(__stream);
    }
    program_state.in_paniclog = 0;
  }
  return;
}

Assistant:

void paniclog(const char *type,   /* panic, impossible, trickery */
	      const char *reason) /* explanation */
{
#ifdef PANICLOG
	FILE *lfile;
	char buf[BUFSZ];

	if (!program_state.in_paniclog) {
		program_state.in_paniclog = 1;
		lfile = fopen_datafile(PANICLOG, "a", TROUBLEPREFIX);
		if (lfile) {
		    fprintf(lfile, "%s %08ld, %ld %s: %s %s\n",
				   version_string(buf), yyyymmdd((time_t)0L),
				   u.ubirthday, (plname[0] ? plname : "(none)"),
				   type, reason);
		    fclose(lfile);
		}
		program_state.in_paniclog = 0;
	}
#endif /* PANICLOG */
	return;
}